

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::buf_del_var(Nvim *this,Buffer buffer,string *name)

{
  allocator local_41;
  string local_40;
  string *local_20;
  string *name_local;
  Buffer buffer_local;
  Nvim *this_local;
  
  local_20 = name;
  name_local = (string *)buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_buf_del_var",&local_41);
  NvimRPC::call<long,std::__cxx11::string>
            (&this->client_,&local_40,(nullptr_t)0x0,(long *)&name_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void Nvim::buf_del_var(Buffer buffer, const std::string& name) {
    client_.call("nvim_buf_del_var", nullptr, buffer, name);
}